

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

void Pdr_ManPrintProgress(Pdr_Man_t *p,int fClose,abctime Time)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  Pdr_Par_t *pPVar6;
  Vec_Vec_t *pVVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  int level;
  Pdr_Man_t *pPVar13;
  int iVar14;
  int iVar15;
  
  if (p->vSolvers->nSize < 2) {
    return;
  }
  iVar14 = 0;
  pPVar13 = p;
  iVar3 = Abc_FrameIsBatchMode();
  if (fClose == 0 && iVar3 != 0) {
    return;
  }
  lVar5 = (long)p->vClauses->nSize;
  if (0 < lVar5) {
    lVar10 = 0;
    iVar14 = 0;
    do {
      uVar8 = *(uint *)((long)p->vClauses->pArray[lVar10] + 4);
      uVar4 = uVar8 + 1;
      pPVar13 = (Pdr_Man_t *)(ulong)uVar4;
      if (1 < uVar4) {
        pPVar13 = (Pdr_Man_t *)0x0;
        do {
          pPVar13 = (Pdr_Man_t *)(ulong)((int)pPVar13 + 1);
          bVar2 = 9 < uVar8;
          uVar8 = uVar8 / 10;
        } while (bVar2);
      }
      iVar14 = iVar14 + (int)pPVar13 + 1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar5);
  }
  iVar3 = 0x3c;
  if (0x3c < iVar14) {
    iVar3 = iVar14;
  }
  Abc_Print((int)pPVar13,"%3d :",(ulong)(p->vSolvers->nSize - 1));
  if (iVar3 == 0x3c) {
    iVar14 = 5;
  }
  else {
    Abc_Print((int)pPVar13," ...");
    iVar14 = 9;
  }
  pVVar7 = p->vClauses;
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    iVar15 = 0;
    do {
      pvVar1 = pVVar7->pArray[lVar5];
      uVar4 = *(uint *)((long)pvVar1 + 4);
      uVar12 = (ulong)uVar4;
      if (iVar15 < iVar3 + -0x3c) {
        uVar4 = uVar4 + 1;
        if (1 < uVar4) {
          uVar4 = 0;
          do {
            uVar8 = (uint)uVar12;
            uVar12 = uVar12 / 10;
            uVar4 = uVar4 + 1;
          } while (9 < uVar8);
        }
      }
      else {
        Abc_Print((int)pPVar13," %d");
        uVar8 = *(uint *)((long)pvVar1 + 4);
        uVar4 = uVar8 + 1;
        uVar9 = uVar4;
        if (1 < uVar4) {
          uVar4 = 0;
          uVar9 = uVar8;
          do {
            uVar4 = uVar4 + 1;
            bVar2 = 9 < uVar9;
            uVar9 = uVar9 / 10;
          } while (bVar2);
          uVar9 = 0;
          do {
            uVar9 = uVar9 + 1;
            bVar2 = 9 < uVar8;
            uVar8 = uVar8 / 10;
          } while (bVar2);
        }
        iVar14 = iVar14 + uVar9 + 1;
        pVVar7 = p->vClauses;
      }
      level = (int)pPVar13;
      iVar15 = iVar15 + uVar4 + 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar7->nSize);
    if (0x45 < iVar14) goto LAB_005758df;
  }
  iVar14 = iVar14 + -0x46;
  do {
    Abc_Print((int)pPVar13," ");
    level = (int)pPVar13;
    iVar14 = iVar14 + 1;
  } while (iVar14 != 0);
LAB_005758df:
  Abc_Print(level,"%6d",(ulong)(uint)p->nQueMax);
  Abc_Print(level,"%10.2f sec",(double)Time / 1000000.0);
  pPVar6 = p->pPars;
  if (pPVar6->fSolveAll != 0) {
    Abc_Print(level,"  CEX =%4d",(ulong)(uint)pPVar6->nFailOuts);
    pPVar6 = p->pPars;
  }
  if (pPVar6->nTimeOutOne != 0) {
    Abc_Print(level,"  T/O =%3d",(ulong)(uint)pPVar6->nDropOuts);
  }
  pcVar11 = "\r";
  if (fClose != 0) {
    pcVar11 = "\n";
  }
  Abc_Print(level,"%s",pcVar11);
  if (fClose != 0) {
    p->nQueMax = 0;
  }
  fflush(_stdout);
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Pdr_ManPrintProgress( Pdr_Man_t * p, int fClose, abctime Time )
{
    Vec_Ptr_t * vVec;
    int i, ThisSize, Length, LengthStart;
    if ( Vec_PtrSize(p->vSolvers) < 2 )
        return;
    if ( Abc_FrameIsBatchMode() && !fClose )
        return;
    // count the total length of the printout
    Length = 0;
    Vec_VecForEachLevel( p->vClauses, vVec, i )
        Length += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
    // determine the starting point
    LengthStart = Abc_MaxInt( 0, Length - 60 );
    Abc_Print( 1, "%3d :", Vec_PtrSize(p->vSolvers)-1 );
    ThisSize = 5;
    if ( LengthStart > 0 )
    {
        Abc_Print( 1, " ..." );
        ThisSize += 4;
    }
    Length = 0;
    Vec_VecForEachLevel( p->vClauses, vVec, i )
    {
        if ( Length < LengthStart )
        {
            Length += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
            continue;
        }
        Abc_Print( 1, " %d", Vec_PtrSize(vVec) );
        Length += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
        ThisSize += 1 + Abc_Base10Log(Vec_PtrSize(vVec)+1);
    }
    for ( i = ThisSize; i < 70; i++ )
        Abc_Print( 1, " " );
    Abc_Print( 1, "%6d", p->nQueMax );
    Abc_Print( 1, "%10.2f sec", 1.0*Time/CLOCKS_PER_SEC );
    if ( p->pPars->fSolveAll )
        Abc_Print( 1, "  CEX =%4d", p->pPars->nFailOuts );
    if ( p->pPars->nTimeOutOne )
        Abc_Print( 1, "  T/O =%3d", p->pPars->nDropOuts );
    Abc_Print( 1, "%s", fClose ? "\n":"\r" );
    if ( fClose )
        p->nQueMax = 0;
    fflush( stdout );
}